

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

void __thiscall
Js::JavascriptRegExp::ExtractSnapObjectDataInto
          (JavascriptRegExp *this,SnapObject *objData,SlabAllocator *alloc)

{
  SnapRegexInfo *this_00;
  RegexFlags RVar1;
  charcount_t length;
  RegexPattern **ppRVar2;
  char16 *str;
  void **ppvVar3;
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  RegexPattern *pattern;
  SnapRegexInfo *sri;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptRegExp *this_local;
  
  sri = (SnapRegexInfo *)alloc;
  alloc_local = (SlabAllocator *)objData;
  objData_local = (SnapObject *)this;
  pattern = (RegexPattern *)
            TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapRegexInfo>(alloc);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                      ((WriteBarrierPtr *)&this->pattern);
  this_00 = sri;
  local_40._16_8_ = *ppRVar2;
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)local_40);
  str = InternalString::GetBuffer((InternalString *)local_40);
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)local_50);
  length = InternalString::GetLength((InternalString *)local_50);
  TTD::SlabAllocatorBase<0>::CopyStringIntoWLength
            ((SlabAllocatorBase<0> *)this_00,str,length,(TTString *)pattern);
  RVar1 = GetFlags(this);
  *(RegexFlags *)&(pattern->library).ptr = RVar1;
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->lastIndexVar)
  ;
  *(void **)&pattern->field_0x18 = *ppvVar3;
  *(Type *)((long)&(pattern->library).ptr + 4) = this->lastIndexOrFlag;
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapRegexInfo*,(TTD::NSSnapObjects::SnapObjectType)17>
            ((SnapObject *)alloc_local,(SnapRegexInfo *)pattern);
  return;
}

Assistant:

void JavascriptRegExp::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapRegexInfo* sri = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapRegexInfo>();

        UnifiedRegex::RegexPattern* pattern = this->pattern;
        alloc.CopyStringIntoWLength(pattern->GetSource().GetBuffer(), pattern->GetSource().GetLength(), sri->RegexStr);
        //split regex should be automatically generated from regex string and flags so no need to exttract it as well

        sri->Flags = this->GetFlags();
        sri->LastIndexVar = TTD_CONVERT_JSVAR_TO_TTDVAR(this->lastIndexVar);
        sri->LastIndexOrFlag = this->lastIndexOrFlag;

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapRegexInfo*, TTD::NSSnapObjects::SnapObjectType::SnapRegexObject>(objData, sri);
    }